

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_check_files.cpp
# Opt level: O3

string * val_to_rnum_abi_cxx11_(string *__return_storage_ptr__,uint32_t i)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  long *plVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  size_type *psVar7;
  bool bVar8;
  string __str;
  string local_60;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  if (numerals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
  {
    p_Var5 = &numerals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var6 = numerals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      bVar8 = p_Var6[1]._M_color < i;
      if (!bVar8) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar8];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != &numerals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) &&
       (p_Var5[1]._M_color <= i)) goto LAB_001046d6;
  }
  cVar3 = '\x01';
  if (9 < i) {
    uVar1 = i;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar1 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_0010461b;
      }
      if (uVar1 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_0010461b;
      }
      if (uVar1 < 10000) goto LAB_0010461b;
      bVar8 = 99999 < uVar1;
      uVar1 = uVar1 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar8);
    cVar3 = cVar3 + '\x01';
  }
LAB_0010461b:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_40,local_38,i);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_60.field_2._M_allocated_capacity = *psVar7;
    local_60.field_2._8_8_ = plVar4[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar7;
    local_60._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_60._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  error(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  p_Var5 = &numerals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
LAB_001046d6:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,p_Var5[1]._M_parent,
             (long)&(p_Var5[1]._M_parent)->_M_color + (long)&(p_Var5[1]._M_left)->_M_color);
  return __return_storage_ptr__;
}

Assistant:

std::string val_to_rnum(uint32_t i)
{
	auto found = numerals.find(i);
	if (found == numerals.end())
	{
		error(std::to_string(i) + " is out of [1, 3999]");
	}
	return found->second;
}